

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_hash.c
# Opt level: O1

void ascon_hash_xof_update(ascon_hash_ctx_t *ctx,uint8_t *data,size_t data_len)

{
  buffered_accumulation(ctx,(uint8_t *)0x0,data,absorb_hash_data,data_len,'\b');
  ctx->flow_state = '\x02';
  return;
}

Assistant:

ASCON_API void
ascon_hash_xof_update(ascon_hash_ctx_t* const ctx,
                      const uint8_t* data,
                      size_t data_len)
{
    ASCON_ASSERT(ctx != NULL);
    ASCON_ASSERT(data_len == 0 || data != NULL);
    ASCON_ASSERT(ctx->flow_state == ASCON_FLOW_HASH_INITIALISED ||
                 ctx->flow_state == ASCON_FLOW_HASH_UPDATED);
    buffered_accumulation(ctx, NULL, data, absorb_hash_data, data_len, ASCON_RATE);
    ctx->flow_state = ASCON_FLOW_HASH_UPDATED;
}